

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover.cxx
# Opt level: O2

void __thiscall FlickerRemover::reset(FlickerRemover *this)

{
  vector<cv::UMat,_std::allocator<cv::UMat>_> *this_00;
  int *__args;
  int iVar1;
  int iVar2;
  uint uVar3;
  UMat *pUVar4;
  uint j;
  uint uVar5;
  uint j_2;
  int *__args_1;
  uint j_1;
  _InputArray local_68;
  Scalar_<double> local_50;
  
  clear(this);
  CircularBuffer<cv::UMat_*>::clear(&this->corresponding_frames_similarity_levels);
  CircularBuffer<cv::UMat_*>::clear(&this->adjacent_frames_similarity_levels);
  cv::Scalar_<double>::Scalar_(&local_50,0.0);
  local_68.flags = -0x3efdfffa;
  local_68.sz.width = 1;
  local_68.sz.height = 4;
  local_68.obj = &local_50;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->flicker_counter,&local_68);
  cv::Scalar_<double>::Scalar_(&local_50,0.0);
  local_68.flags = -0x3efdfffa;
  local_68.sz.width = 1;
  local_68.sz.height = 4;
  local_68.obj = &local_50;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->corresponding_frames_similarity_sum,&local_68);
  cv::Scalar_<double>::Scalar_(&local_50,0.0);
  local_68.flags = -0x3efdfffa;
  local_68.sz.width = 1;
  local_68.sz.height = 4;
  local_68.obj = &local_50;
  cv::noArray();
  cv::UMat::setTo((_InputArray *)&this->adjacent_frames_similarity_sum,&local_68);
  this_00 = &this->masks;
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::clear(this_00);
  std::vector<cv::UMat,_std::allocator<cv::UMat>_>::reserve(this_00,(ulong)this->number_of_masks);
  __args = &this->frame_rows;
  __args_1 = &this->frame_cols;
  for (uVar5 = 0; uVar5 < this->number_of_masks; uVar5 = uVar5 + 1) {
    local_68.flags = 3;
    cv::Scalar_<double>::Scalar_(&local_50,0.0);
    std::vector<cv::UMat,std::allocator<cv::UMat>>::
    emplace_back<int_const&,int_const&,int,cv::Scalar_<double>>
              ((vector<cv::UMat,std::allocator<cv::UMat>> *)this_00,__args,__args_1,&local_68.flags,
               &local_50);
  }
  this->actual_mask = this->number_of_masks;
  for (uVar5 = 0; uVar3 = this->block_size, uVar5 < uVar3; uVar5 = uVar5 + 1) {
    pUVar4 = (UMat *)operator_new(0x50);
    iVar1 = *__args;
    iVar2 = *__args_1;
    cv::Scalar_<double>::Scalar_(&local_50,0.0);
    cv::UMat::UMat(pUVar4,iVar1,iVar2,0,&local_50,0);
    CircularBuffer<cv::UMat_*>::push(&this->corresponding_frames_similarity_levels,pUVar4);
  }
  for (uVar5 = 0; uVar5 < uVar3 - 1; uVar5 = uVar5 + 1) {
    pUVar4 = (UMat *)operator_new(0x50);
    iVar1 = *__args;
    iVar2 = *__args_1;
    cv::Scalar_<double>::Scalar_(&local_50,0.0);
    cv::UMat::UMat(pUVar4,iVar1,iVar2,0,&local_50,0);
    CircularBuffer<cv::UMat_*>::push(&this->adjacent_frames_similarity_levels,pUVar4);
    uVar3 = this->block_size;
  }
  CircularBuffer<cv::UMat_*>::clear(&this->frames_block);
  return;
}

Assistant:

void FlickerRemover::reset()
{
    clear();
    corresponding_frames_similarity_levels.clear();
    adjacent_frames_similarity_levels.clear();
    flicker_counter.setTo(Scalar(0));
    corresponding_frames_similarity_sum.setTo(Scalar(0));
    adjacent_frames_similarity_sum.setTo(Scalar(0));
    masks.clear();
    masks.reserve(number_of_masks);
    for(unsigned int j = 0; j < number_of_masks; j++) {
        masks.emplace_back(frame_rows, frame_cols, CV_16S, Scalar(0));
    }
    actual_mask = number_of_masks;
    for(unsigned int j = 0; j < block_size; j++) {
        corresponding_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    for(unsigned int j = 0; j < block_size - 1; j++) {
        adjacent_frames_similarity_levels.push(new UMat(frame_rows, frame_cols, CV_8UC1, Scalar(0)));
    }
    frames_block.clear();
}